

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

void Fra_ObjAddToFrontier(Fra_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vFrontier_local;
  Aig_Obj_t *pObj_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0xd7,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Fra_ObjSatNum(pObj);
  if (iVar1 == 0) {
    iVar1 = Fra_ObjSatNum(pObj);
    if (iVar1 != 0) {
      __assert_fail("Fra_ObjSatNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0xda,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pVVar2 = Fra_ObjFaninVec(pObj);
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      __assert_fail("Fra_ObjFaninVec(pObj) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0xdb,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      Fra_ObjSetSatNum(pObj,iVar1);
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 != 0) {
        Vec_PtrPush(vFrontier,pObj);
      }
    }
  }
  return;
}

Assistant:

void Fra_ObjAddToFrontier( Fra_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Fra_ObjSatNum(pObj) )
        return;
    assert( Fra_ObjSatNum(pObj) == 0 );
    assert( Fra_ObjFaninVec(pObj) == NULL );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Fra_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}